

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-expr-visitor.h
# Opt level: O2

void __thiscall
mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::VisitUnsupported
          (BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *this,Expr e)

{
  UnsupportedError *__return_storage_ptr__;
  CStringRef arg0;
  
  __return_storage_ptr__ = (UnsupportedError *)__cxa_allocate_exception(0x18);
  arg0.data_ = mp::expr::str(*(Kind *)e.super_ExprBase.impl_);
  MakeUnsupportedError<>(__return_storage_ptr__,arg0);
  __cxa_throw(__return_storage_ptr__,&UnsupportedError::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

Result VisitUnsupported(Expr e) {
    throw MakeUnsupportedError(str(e.kind()));
  }